

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

int __thiscall
glslang::TIntermediate::addUsedLocation
          (TIntermediate *this,TQualifier *qualifier,TType *type,bool *typeCollision)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar7;
  ulong uVar8;
  EShLanguage stage;
  TIoRange *__x;
  TType *type_00;
  vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_> *this_00;
  uint set;
  ulong uVar9;
  TIoRange range;
  TIoRange range2;
  
  *typeCollision = false;
  uVar5 = (uint)*(ulong *)&qualifier->field_0x8;
  uVar7 = uVar5 & 0x7f;
  uVar4 = 1;
  switch(uVar7) {
  case 3:
  case 0x14:
  case 0x15:
  case 0x19:
  case 0x1a:
  case 0x1b:
    set = 0;
    goto LAB_0037873d;
  case 4:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x1c:
  case 0x1d:
  case 0x1e:
    set = uVar4;
    goto LAB_0037873d;
  case 5:
    set = 2;
    break;
  case 6:
    set = 3;
    break;
  default:
    set = 0;
    if (uVar7 - 9 < 2) goto LAB_003787db;
    set = uVar4;
    if ((uVar5 & 0x7e) != 0xc) {
      if ((uVar5 & 0x7f) != 0xe) {
        return -1;
      }
      set = 2;
    }
LAB_0037873d:
    if (uVar7 - 9 < 2) goto LAB_003787db;
    break;
  case 0x1f:
    set = 4;
  }
  uVar4 = 1;
  if ((uVar5 & 0x7e) != 0xc) {
    if ((*(ulong *)&qualifier->field_0x8 >> 0x2b & 1) == 0 && 1 < uVar7 - 5) {
      iVar3 = (*type->_vptr_TType[0x1d])(type);
      if (((char)iVar3 == '\0') ||
         (bVar2 = TQualifier::isArrayedIo(qualifier,this->language), !bVar2)) {
        stage = this->language;
        type_00 = type;
      }
      else {
        TType::TType((TType *)&range,type,0,false);
        stage = this->language;
        type_00 = (TType *)&range;
      }
      uVar4 = computeTypeLocationSize(type_00,stage);
    }
    else {
      iVar3 = (*type->_vptr_TType[0x1e])();
      if ((char)iVar3 != '\0') {
        uVar4 = (*type->_vptr_TType[0x11])(type);
      }
    }
  }
LAB_003787db:
  uVar7 = (uint)*(undefined8 *)&qualifier->field_0x8;
  uVar5 = uVar7 & 0x7f;
  if (((uVar5 == 0xe) || ((uVar7 & 0x7e) == 0xc)) || (uVar5 - 9 < 2)) {
    uVar4 = *(uint *)&qualifier->field_0x1c;
    range.location = (TRange)(CONCAT44(uVar4,uVar4) & 0xfff00000fff);
    iVar3 = checkLocationRT(this,set,uVar4 & 0xfff);
    if (-1 < iVar3) {
      return iVar3;
    }
    std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::push_back
              (this->usedIoRT + set,&range.location);
    return iVar3;
  }
  if (((uVar4 == 2) && (iVar3 = (*type->_vptr_TType[7])(type), iVar3 == 2)) &&
     ((iVar3 = (*type->_vptr_TType[0xc])(type), iVar3 == 3 &&
      (((*(uint *)&qualifier->field_0x8 & 0x7f) < 0x1f &&
       ((0x7ff00018U >> (*(uint *)&qualifier->field_0x8 & 0x1f) & 1) != 0)))))) {
    uVar1 = *(undefined8 *)&qualifier->field_0x1c;
    range.basicType = (*type->_vptr_TType[7])(type);
    uVar8 = *(ulong *)&qualifier->field_0x8;
    range.centroid = (bool)((byte)(uVar8 >> 0x1d) & 1);
    range.smooth = (bool)((byte)(uVar8 >> 0x1e) & 1);
    range.flat = (bool)((byte)(uVar8 >> 0x1f) & 1);
    range.sample = (bool)((byte)(uVar8 >> 0x2d) & 1);
    range.patch = (bool)((byte)(uVar8 >> 0x2c) & 1);
    range.component.start = 0;
    range.component.last = 3;
    range.index = 0;
    range.location = (TRange)((ulong)((uint)uVar1 & 0xfff) * 0x100000001);
    iVar3 = checkLocationRange(this,set,&range,type,typeCollision);
    if (-1 < iVar3) {
      return iVar3;
    }
    this_00 = this->usedIo + set;
    std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::push_back(this_00,&range);
    uVar1 = *(undefined8 *)&qualifier->field_0x1c;
    range2.basicType = (*type->_vptr_TType[7])(type);
    uVar8 = *(ulong *)&qualifier->field_0x8;
    range2.centroid = (bool)((byte)(uVar8 >> 0x1d) & 1);
    range2.smooth = (bool)((byte)(uVar8 >> 0x1e) & 1);
    range2.flat = (bool)((byte)(uVar8 >> 0x1f) & 1);
    range2.sample = (bool)((byte)(uVar8 >> 0x2d) & 1);
    range2.patch = (bool)((byte)(uVar8 >> 0x2c) & 1);
    range2.component.start = 0;
    range2.component.last = 1;
    range2.index = 0;
    range2.location = (TRange)((ulong)((uint)uVar1 & 0xfff) * 0x100000001 + 0x100000001);
    iVar3 = checkLocationRange(this,set,&range2,type,typeCollision);
    if (-1 < iVar3) {
      return iVar3;
    }
    __x = &range2;
  }
  else {
    uVar5 = (uint)*(undefined8 *)&qualifier->field_0x1c;
    if (((uVar5 & 0x7000) == 0x4000) && (iVar3 = (*type->_vptr_TType[0xc])(type), iVar3 < 1)) {
      uVar9 = 0x300000000;
      uVar8 = 0;
    }
    else {
      iVar3 = (*type->_vptr_TType[0xc])(type);
      iVar6 = (*type->_vptr_TType[7])(type);
      uVar8 = 0;
      if ((*(uint *)&qualifier->field_0x1c & 0x7000) != 0x4000) {
        uVar8 = (ulong)(*(uint *)&qualifier->field_0x1c >> 0xc) & 0xffffffff00000007;
      }
      uVar9 = (ulong)(((iVar3 << (iVar6 == 2)) + (int)uVar8) - 1) << 0x20;
    }
    range.basicType = (*type->_vptr_TType[7])();
    if (range.basicType == EbtSampler) {
      iVar3 = (*type->_vptr_TType[8])();
      if (*(char *)(CONCAT44(extraout_var,iVar3) + 1) == '\b') {
        iVar3 = (*type->_vptr_TType[8])();
        range.basicType = (TBasicType)*(byte *)CONCAT44(extraout_var_00,iVar3);
      }
      else {
        range.basicType = EbtSampler;
      }
    }
    range.location = (TRange)(CONCAT44(uVar4 + (uVar5 & 0xfff) + -1,uVar5) & 0xffffffff00000fff);
    range.component = (TRange)(uVar8 | uVar9);
    uVar8 = *(ulong *)&qualifier->field_0x8;
    range.index = (ushort)((ulong)*(undefined8 *)&qualifier->field_0x1c >> 0x30) & 0xff;
    if ((char)((ulong)*(undefined8 *)&qualifier->field_0x1c >> 0x30) == -1) {
      range.index = 0;
    }
    range.centroid = (bool)((byte)(uVar8 >> 0x1d) & 1);
    range.smooth = (bool)((byte)(uVar8 >> 0x1e) & 1);
    range.flat = (bool)((byte)(uVar8 >> 0x1f) & 1);
    range.sample = (bool)((byte)(uVar8 >> 0x2d) & 1);
    range.patch = (bool)((byte)(uVar8 >> 0x2c) & 1);
    if ((((this->profile == EEsProfile) || (this->language != EShLangVertex)) ||
        (0x1b < ((uint)uVar8 & 0x7f))) ||
       (((0xe300008U >> ((uint)uVar8 & 0x1f) & 1) == 0 || (0 < (this->spvVersion).vulkan)))) {
      iVar3 = checkLocationRange(this,set,&range,type,typeCollision);
      if (-1 < iVar3) {
        return iVar3;
      }
    }
    else {
      iVar3 = -1;
    }
    this_00 = this->usedIo + set;
    __x = &range;
  }
  std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::push_back(this_00,__x);
  return iVar3;
}

Assistant:

int TIntermediate::addUsedLocation(const TQualifier& qualifier, const TType& type, bool& typeCollision)
{
    typeCollision = false;

    int set;
    if (qualifier.isPipeInput())
        set = 0;
    else if (qualifier.isPipeOutput())
        set = 1;
    else if (qualifier.storage == EvqUniform)
        set = 2;
    else if (qualifier.storage == EvqBuffer)
        set = 3;
    else if (qualifier.storage == EvqTileImageEXT)
        set = 4;
    else if (qualifier.isAnyPayload())
        set = 0;
    else if (qualifier.isAnyCallable())
        set = 1;
    else if (qualifier.isHitObjectAttrNV())
        set = 2;
    else
        return -1;

    int size;
    if (qualifier.isAnyPayload() || qualifier.isAnyCallable()) {
        size = 1;
    } else if (qualifier.isUniformOrBuffer() || qualifier.isTaskMemory()) {
        if (type.isSizedArray())
            size = type.getCumulativeArraySize();
        else
            size = 1;
    } else {
        // Strip off the outer array dimension for those having an extra one.
        if (type.isArray() && qualifier.isArrayedIo(language)) {
            TType elementType(type, 0);
            size = computeTypeLocationSize(elementType, language);
        } else
            size = computeTypeLocationSize(type, language);
    }

    // Locations, and components within locations.
    //
    // Almost always, dealing with components means a single location is involved.
    // The exception is a dvec3. From the spec:
    //
    // "A dvec3 will consume all four components of the first location and components 0 and 1 of
    // the second location. This leaves components 2 and 3 available for other component-qualified
    // declarations."
    //
    // That means, without ever mentioning a component, a component range
    // for a different location gets specified, if it's not a vertex shader input. (!)
    // (A vertex shader input will show using only one location, even for a dvec3/4.)
    //
    // So, for the case of dvec3, we need two independent ioRanges.
    //
    // For raytracing IO (payloads and callabledata) each declaration occupies a single
    // slot irrespective of type.
    int collision = -1; // no collision
    if (qualifier.isAnyPayload() || qualifier.isAnyCallable() || qualifier.isHitObjectAttrNV()) {
        TRange range(qualifier.layoutLocation, qualifier.layoutLocation);
        collision = checkLocationRT(set, qualifier.layoutLocation);
        if (collision < 0)
            usedIoRT[set].push_back(range);
        return collision;
    }
    if (size == 2 && type.getBasicType() == EbtDouble && type.getVectorSize() == 3 &&
        (qualifier.isPipeInput() || qualifier.isPipeOutput())) {
        // Dealing with dvec3 in/out split across two locations.
        // Need two io-ranges.
        // The case where the dvec3 doesn't start at component 0 was previously caught as overflow.

        // First range:
        TRange locationRange(qualifier.layoutLocation, qualifier.layoutLocation);
        TRange componentRange(0, 3);
        TIoRange range(locationRange, componentRange, type.getBasicType(), 0, qualifier.centroid, qualifier.smooth, qualifier.flat, qualifier.sample, qualifier.patch);

        // check for collisions
        collision = checkLocationRange(set, range, type, typeCollision);
        if (collision < 0) {
            usedIo[set].push_back(range);

            // Second range:
            TRange locationRange2(qualifier.layoutLocation + 1, qualifier.layoutLocation + 1);
            TRange componentRange2(0, 1);
            TIoRange range2(locationRange2, componentRange2, type.getBasicType(), 0, qualifier.centroid, qualifier.smooth, qualifier.flat, qualifier.sample, qualifier.patch);

            // check for collisions
            collision = checkLocationRange(set, range2, type, typeCollision);
            if (collision < 0)
                usedIo[set].push_back(range2);
        }
        return collision;
    }

    // Not a dvec3 in/out split across two locations, generic path.
    // Need a single IO-range block.

    TRange locationRange(qualifier.layoutLocation, qualifier.layoutLocation + size - 1);
    TRange componentRange(0, 3);
    if (qualifier.hasComponent() || type.getVectorSize() > 0) {
        int consumedComponents = type.getVectorSize() * (type.getBasicType() == EbtDouble ? 2 : 1);
        if (qualifier.hasComponent())
            componentRange.start = qualifier.layoutComponent;
        componentRange.last  = componentRange.start + consumedComponents - 1;
    }

    // combine location and component ranges
    TBasicType basicTy = type.getBasicType();
    if (basicTy == EbtSampler && type.getSampler().isAttachmentEXT())
        basicTy = type.getSampler().type;
    TIoRange range(locationRange, componentRange, basicTy, qualifier.hasIndex() ? qualifier.getIndex() : 0, qualifier.centroid, qualifier.smooth, qualifier.flat, qualifier.sample, qualifier.patch);

    // check for collisions, except for vertex inputs on desktop targeting OpenGL
    if (! (!isEsProfile() && language == EShLangVertex && qualifier.isPipeInput()) || spvVersion.vulkan > 0)
        collision = checkLocationRange(set, range, type, typeCollision);

    if (collision < 0)
        usedIo[set].push_back(range);

    return collision;
}